

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiContext_conflict1 *pIVar1;
  ImGuiWindow_conflict *pIVar2;
  
  pIVar1 = GImGui;
  if (layer == ImGuiNavLayer_Main) {
    pIVar2 = NavRestoreLastChildNavWindow(GImGui->NavWindow);
    pIVar1->NavWindow = pIVar2;
  }
  pIVar2 = pIVar1->NavWindow;
  if (pIVar2->NavLastIds[layer] == 0) {
    pIVar1->NavLayer = layer;
    NavInitWindow(pIVar2,true);
  }
  else {
    SetNavID(pIVar2->NavLastIds[layer],layer,0,pIVar2->NavRectRel + layer);
  }
  pIVar1->NavMousePosDirty = true;
  pIVar1->NavDisableHighlight = false;
  pIVar1->NavDisableMouseHover = true;
  return;
}

Assistant:

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    if (layer == ImGuiNavLayer_Main)
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
    {
        SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
    }
    else
    {
        g.NavLayer = layer;
        NavInitWindow(window, true);
    }
    g.NavDisableHighlight = false;
    g.NavDisableMouseHover = g.NavMousePosDirty = true;
}